

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O1

size_t portability_path_get_name(char *path,size_t path_size,char *name,size_t name_size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  ulong uVar5;
  
  if (name != (char *)0x0 && path != (char *)0x0) {
    cVar4 = *path;
    if ((name_size == 0 || path_size == 0) || cVar4 == '\0') {
      uVar1 = 0;
      uVar2 = 0;
    }
    else {
      uVar3 = 1;
      uVar2 = 0;
      uVar5 = 0;
      do {
        name[uVar5] = cVar4;
        if (path[uVar3 - 1] == '/') {
          uVar1 = 0;
        }
        else {
          uVar1 = uVar5 + 1;
          if (path[uVar3 - 1] == '.') {
            if ((uVar3 == 1) || (path[uVar3 - 2] != '.')) {
              uVar2 = uVar5;
              if (uVar1 == 0) {
                uVar2 = uVar1;
              }
            }
            else {
              uVar1 = 0;
              uVar2 = 0;
            }
          }
        }
      } while (((uVar3 < path_size) && (cVar4 = path[uVar3], cVar4 != '\0')) &&
              (uVar3 = uVar3 + 1, uVar5 = uVar1, uVar1 < name_size));
    }
    if (uVar1 < 2) {
      uVar1 = uVar2;
    }
    if (uVar2 != 0) {
      uVar1 = uVar2;
    }
    name[uVar1] = '\0';
    return uVar1 + 1;
  }
  return 0;
}

Assistant:

size_t portability_path_get_name(const char *path, size_t path_size, char *name, size_t name_size)
{
	if (path == NULL || name == NULL)
	{
		return 0;
	}

	size_t i, count, last;

	for (i = 0, count = 0, last = 0; path[i] != '\0' && i < path_size && count < name_size; ++i)
	{
		name[count++] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			count = 0;
		}
		else if (path[i] == '.')
		{
			if (i > 0 && path[i - 1] == '.')
			{
				last = 0;
				count = 0;
			}
			else
			{
				if (count > 0)
				{
					last = count - 1;
				}
				else
				{
					last = 0;
				}
			}
		}
	}

	if (last == 0 && count > 1)
	{
		last = count;
	}

	name[last] = '\0';

	return last + 1;
}